

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void amrex::FArrayBox::Initialize(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar4;
  RealDescriptor *pRVar5;
  ostream *poVar6;
  int __flags;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  __fn *__fn;
  char *pcVar7;
  void *in_R8;
  string ord;
  FABio *fio;
  string fmt;
  ParmParse pp;
  RealDescriptor *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  undefined5 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  ParmParse *in_stack_fffffffffffffec0;
  string local_e8 [32];
  string *local_c8;
  string local_c0 [55];
  allocator local_89;
  string local_88 [120];
  undefined8 local_10;
  undefined8 local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if ((initialized & 1) == 0) {
    initialized = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"fab",&local_89);
    ParmParse::ParmParse
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT15(in_stack_fffffffffffffe45,in_stack_fffffffffffffe40))),
               in_stack_fffffffffffffe38);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::string(local_c0);
    __fn = (__fn *)0x1950bc7;
    __flags = 0;
    iVar2 = ParmParse::query(in_stack_fffffffffffffec0,
                             (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                             in_stack_fffffffffffffeb0,iVar3);
    if (iVar2 == 0) {
      format = 2;
      operator_new(0x10);
      pRVar5 = FPC::NativeRealDescriptor();
      RealDescriptor::clone(pRVar5,__fn,__child_stack_02,__flags,in_R8);
      FABio_binary::FABio_binary
                ((FABio_binary *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      setFABio((FABio *)in_stack_fffffffffffffe30);
    }
    else {
      local_c8 = (string *)0x0;
      bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      if (bVar1) {
        format = 0;
        psVar4 = (string *)operator_new(8);
        FABio_ascii::FABio_ascii((FABio_ascii *)in_stack_fffffffffffffe30);
        local_c8 = psVar4;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
        if (bVar1) {
          format = 4;
          psVar4 = (string *)operator_new(8);
          FABio_8bit::FABio_8bit((FABio_8bit *)in_stack_fffffffffffffe30);
          local_c8 = psVar4;
        }
        else {
          pcVar7 = "NATIVE";
          bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
          if (bVar1) {
            format = 2;
            psVar4 = (string *)operator_new(0x10);
            pRVar5 = FPC::NativeRealDescriptor();
            iVar2 = RealDescriptor::clone(pRVar5,(__fn *)pcVar7,__child_stack,__flags,in_R8);
            in_stack_fffffffffffffec0 = (ParmParse *)CONCAT44(extraout_var,iVar2);
            FABio_binary::FABio_binary
                      ((FABio_binary *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            local_c8 = psVar4;
          }
          else {
            pcVar7 = "NATIVE_32";
            in_stack_fffffffffffffebf =
                 std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
            if ((bool)in_stack_fffffffffffffebf) {
              format = 6;
              in_stack_fffffffffffffeb0 = (string *)operator_new(0x10);
              pRVar5 = FPC::Native32RealDescriptor();
              RealDescriptor::clone(pRVar5,(__fn *)pcVar7,__child_stack_00,__flags,in_R8);
              iVar3 = (int)((ulong)pRVar5 >> 0x20);
              FABio_binary::FABio_binary
                        ((FABio_binary *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              local_c8 = in_stack_fffffffffffffeb0;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
              if ((bVar1) ||
                 (bVar1 = std::operator==(in_stack_fffffffffffffe30,
                                          (char *)in_stack_fffffffffffffe28), bVar1)) {
                pcVar7 = "IEEE";
                bVar1 = std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28)
                ;
                if (bVar1) {
                  format = 1;
                }
                else {
                  format = 5;
                }
                psVar4 = (string *)operator_new(0x10);
                pRVar5 = FPC::Ieee32NormalRealDescriptor();
                RealDescriptor::clone(pRVar5,(__fn *)pcVar7,__child_stack_01,__flags,in_R8);
                FABio_binary::FABio_binary
                          ((FABio_binary *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
                local_c8 = psVar4;
              }
              else {
                poVar6 = ErrorStream();
                poVar6 = std::operator<<(poVar6,"FArrayBox::init(): Bad FABio::Format = ");
                std::operator<<(poVar6,local_c0);
                local_8 = 0;
                Abort_host((char *)CONCAT17(in_stack_fffffffffffffe47,
                                            CONCAT16(in_stack_fffffffffffffe46,
                                                     CONCAT15(in_stack_fffffffffffffe45,
                                                              in_stack_fffffffffffffe40))));
              }
            }
          }
        }
      }
      setFABio((FABio *)in_stack_fffffffffffffe30);
    }
    std::__cxx11::string::string(local_e8);
    iVar3 = ParmParse::query(in_stack_fffffffffffffec0,
                             (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                             in_stack_fffffffffffffeb0,iVar3);
    if (iVar3 != 0) {
      in_stack_fffffffffffffe47 =
           std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
      if ((bool)in_stack_fffffffffffffe47) {
        setOrdering(FAB_NORMAL_ORDER);
      }
      else {
        in_stack_fffffffffffffe46 =
             std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
        if ((bool)in_stack_fffffffffffffe46) {
          setOrdering(FAB_REVERSE_ORDER);
        }
        else {
          in_stack_fffffffffffffe45 =
               std::operator==(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
          if ((bool)in_stack_fffffffffffffe45) {
            setOrdering(FAB_REVERSE_ORDER_2);
          }
          else {
            in_stack_fffffffffffffe38 = (string *)ErrorStream();
            in_stack_fffffffffffffe30 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::operator<<((ostream *)in_stack_fffffffffffffe38,
                                 "FArrayBox::init(): Bad FABio::Ordering = ");
            std::operator<<((ostream *)in_stack_fffffffffffffe30,local_e8);
            local_10 = 0;
            Abort_host((char *)CONCAT17(in_stack_fffffffffffffe47,
                                        CONCAT16(in_stack_fffffffffffffe46,
                                                 CONCAT15(in_stack_fffffffffffffe45,
                                                          in_stack_fffffffffffffe40))));
          }
        }
      }
    }
    initval = std::numeric_limits<double>::quiet_NaN();
    ParmParse::queryAdd<double,_0>
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT15(in_stack_fffffffffffffe45,in_stack_fffffffffffffe40))),
               (char *)in_stack_fffffffffffffe38,(double *)in_stack_fffffffffffffe30);
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT15(in_stack_fffffffffffffe45,in_stack_fffffffffffffe40))),
               (char *)in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30);
    ParmParse::queryAdd<bool,_0>
              ((ParmParse *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,
                                 CONCAT15(in_stack_fffffffffffffe45,in_stack_fffffffffffffe40))),
               (char *)in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30);
    ExecOnFinalize((PTR_TO_VOID_FUNC)0x127a167);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c0);
    ParmParse::~ParmParse((ParmParse *)0x127a190);
  }
  return;
}

Assistant:

void
FArrayBox::Initialize ()
{
    if (initialized) return;
    initialized = true;

    BL_ASSERT(fabio == 0);

    ParmParse pp("fab");

    std::string fmt;
    //
    // This block can legitimately set FAB output format.
    //
    if (pp.query("format", fmt))
    {
        FABio* fio = 0;

        if (fmt == "ASCII")
        {
            FArrayBox::format = FABio::FAB_ASCII;
            fio = new FABio_ascii;
        }
        else if (fmt == "8BIT")
        {
            FArrayBox::format = FABio::FAB_8BIT;
            fio = new FABio_8bit;
        }
        else if (fmt == "NATIVE")
        {
            FArrayBox::format = FABio::FAB_NATIVE;
            fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        }
        else if (fmt == "NATIVE_32")
        {
            FArrayBox::format = FABio::FAB_NATIVE_32;
            fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        }
        else if (fmt == "IEEE" || fmt == "IEEE32")
        {
            if (fmt == "IEEE")
            {
                FArrayBox::format = FABio::FAB_IEEE;
                //amrex::Warning("IEEE fmt in ParmParse files is deprecated");
            }
            else
            {
                FArrayBox::format = FABio::FAB_IEEE_32;
            }
            fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        }
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Format = " << fmt;
            amrex::Abort();
        }

        setFABio(fio);
    }
    else
    {
        //
        // We default to "NATIVE" if nothing is specified.
        //
        FArrayBox::format = FABio::FAB_NATIVE;

        setFABio(new FABio_binary(FPC::NativeRealDescriptor().clone()));
    }
    //
    // This block sets ordering which doesn't affect output format.
    // It is only used when reading in an old FAB.
    //
    std::string ord;

    if (pp.query("ordering", ord))
    {
        if (ord == "NORMAL_ORDER")
            FArrayBox::setOrdering(FABio::FAB_NORMAL_ORDER);
        else if (ord == "REVERSE_ORDER")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER);
        else if (ord == "REVERSE_ORDER_2")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER_2);
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Ordering = " << ord;
            amrex::Abort();
        }
    }

    initval = std::numeric_limits<Real>::has_quiet_NaN
            ? std::numeric_limits<Real>::quiet_NaN()
            : std::numeric_limits<Real>::max();

    pp.queryAdd("initval",    initval);
    pp.queryAdd("do_initval", do_initval);
    pp.queryAdd("init_snan", init_snan);

    amrex::ExecOnFinalize(FArrayBox::Finalize);
}